

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmeta.h
# Opt level: O2

int __thiscall
CVmMetaTable::prop_to_vector_idx(CVmMetaTable *this,uint reg_table_idx,vm_prop_id_t prop)

{
  unsigned_short uVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (this->table_ != (vm_meta_entry_t *)0x0 && -1 < (long)this->reverse_map_[reg_table_idx]) {
    uVar1 = vm_meta_entry_t::xlat_prop(this->table_ + this->reverse_map_[reg_table_idx],prop);
    uVar2 = (uint)uVar1;
  }
  return uVar2;
}

Assistant:

int prop_to_vector_idx(uint reg_table_idx, vm_prop_id_t prop)
    {
        /* get the entry for the registration table index */
        vm_meta_entry_t *entry = get_entry_from_reg(reg_table_idx);
        
        /* 
         *   if there's no entry for this registration index, there's
         *   obviously no metaclass function mapping for the property 
         */
        if (entry == 0)
            return 0;

        /* return the property translation */
        return entry->xlat_prop(prop);
    }